

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

void Hacl_Bignum256_32_sqr(uint32_t *a,uint32_t *res)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t c1;
  uint32_t lo_7;
  uint32_t hi_7;
  uint64_t res1_7;
  uint32_t lo_6;
  uint32_t hi_6;
  uint64_t res1_6;
  uint32_t lo_5;
  uint32_t hi_5;
  uint64_t res1_5;
  uint32_t lo_4;
  uint32_t hi_4;
  uint64_t res1_4;
  uint32_t lo_3;
  uint32_t hi_3;
  uint64_t res1_3;
  uint32_t lo_2;
  uint32_t hi_2;
  uint64_t res1_2;
  uint32_t lo_1;
  uint32_t hi_1;
  uint64_t res1_1;
  uint32_t lo;
  uint32_t hi;
  uint64_t res1;
  long local_428;
  uint32_t i_16;
  uint32_t tmp [16];
  uint32_t c0;
  uint32_t r_7;
  uint32_t *res_i_15;
  uint32_t a_i_15;
  uint32_t i_15;
  uint32_t *res_i_14;
  uint32_t a_i2_7;
  uint32_t *res_i2_7;
  uint32_t a_i1_7;
  uint32_t *res_i1_7;
  uint32_t a_i0_7;
  uint32_t *res_i0_7;
  uint32_t a_i_14;
  uint32_t i_14;
  uint32_t c_7;
  uint32_t *res_j_7;
  uint32_t a_j_7;
  uint32_t *ab_7;
  uint32_t r_6;
  uint32_t *res_i_13;
  uint32_t a_i_13;
  uint32_t i_13;
  uint32_t *res_i_12;
  uint32_t a_i2_6;
  uint32_t *res_i2_6;
  uint32_t a_i1_6;
  uint32_t *res_i1_6;
  uint32_t a_i0_6;
  uint32_t *res_i0_6;
  uint32_t a_i_12;
  uint32_t i_12;
  uint32_t c_6;
  uint32_t *res_j_6;
  uint32_t a_j_6;
  uint32_t *ab_6;
  uint32_t r_5;
  uint32_t *res_i_11;
  uint32_t a_i_11;
  uint32_t i_11;
  uint32_t *res_i_10;
  uint32_t a_i2_5;
  uint32_t *res_i2_5;
  uint32_t a_i1_5;
  uint32_t *res_i1_5;
  uint32_t a_i0_5;
  uint32_t *res_i0_5;
  uint32_t a_i_10;
  uint32_t i_10;
  uint32_t c_5;
  uint32_t *res_j_5;
  uint32_t a_j_5;
  uint32_t *ab_5;
  uint32_t r_4;
  uint32_t *res_i_9;
  uint32_t a_i_9;
  uint32_t i_9;
  uint32_t *res_i_8;
  uint32_t a_i2_4;
  uint32_t *res_i2_4;
  uint32_t a_i1_4;
  uint32_t *res_i1_4;
  uint32_t a_i0_4;
  uint32_t *res_i0_4;
  uint32_t a_i_8;
  uint32_t i_8;
  uint32_t c_4;
  uint32_t *res_j_4;
  uint32_t a_j_4;
  uint32_t *ab_4;
  uint32_t r_3;
  uint32_t *res_i_7;
  uint32_t a_i_7;
  uint32_t i_7;
  uint32_t *res_i_6;
  uint32_t a_i2_3;
  uint32_t *res_i2_3;
  uint32_t a_i1_3;
  uint32_t *res_i1_3;
  uint32_t a_i0_3;
  uint32_t *res_i0_3;
  uint32_t a_i_6;
  uint32_t i_6;
  uint32_t c_3;
  uint32_t *res_j_3;
  uint32_t a_j_3;
  uint32_t *ab_3;
  uint32_t r_2;
  uint32_t *res_i_5;
  uint32_t a_i_5;
  uint32_t i_5;
  uint32_t *res_i_4;
  uint32_t a_i2_2;
  uint32_t *res_i2_2;
  uint32_t a_i1_2;
  uint32_t *res_i1_2;
  uint32_t a_i0_2;
  uint32_t *res_i0_2;
  uint32_t a_i_4;
  uint32_t i_4;
  uint32_t c_2;
  uint32_t *res_j_2;
  uint32_t a_j_2;
  uint32_t *ab_2;
  uint32_t r_1;
  uint32_t *res_i_3;
  uint32_t a_i_3;
  uint32_t i_3;
  uint32_t *res_i_2;
  uint32_t a_i2_1;
  uint32_t *res_i2_1;
  uint32_t a_i1_1;
  uint32_t *res_i1_1;
  uint32_t a_i0_1;
  uint32_t *res_i0_1;
  uint32_t a_i_2;
  uint32_t i_2;
  uint32_t c_1;
  uint32_t *res_j_1;
  uint32_t a_j_1;
  uint32_t *ab_1;
  uint32_t r;
  uint32_t *res_i_1;
  uint32_t a_i_1;
  uint32_t i_1;
  uint32_t *res_i;
  uint32_t a_i2;
  uint32_t *res_i2;
  uint32_t a_i1;
  uint32_t *res_i1;
  uint32_t a_i0;
  uint32_t *res_i0;
  uint32_t a_i;
  uint32_t i;
  uint32_t c;
  uint32_t *res_j;
  uint32_t a_j;
  uint32_t *ab;
  uint32_t i0;
  uint32_t *res_local;
  uint32_t *a_local;
  
  memset(res,0,0x40);
  *res = 0;
  uVar1 = a[1];
  a_i_2 = 0;
  bVar2 = false;
  while (!bVar2) {
    a_i_2 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar1,a_i_2,res + 1);
    bVar2 = true;
  }
  res[2] = a_i_2;
  uVar1 = a[2];
  a_i_4 = 0;
  for (res_i_5._4_4_ = 0; res_i_5._4_4_ < 2; res_i_5._4_4_ = res_i_5._4_4_ + 1) {
    a_i_4 = Hacl_Bignum_Base_mul_wide_add2_u32
                      (a[res_i_5._4_4_],uVar1,a_i_4,res + (ulong)res_i_5._4_4_ + 2);
  }
  res[4] = a_i_4;
  uVar1 = a[3];
  a_i_6 = 0;
  for (res_i_7._4_4_ = 0; res_i_7._4_4_ < 3; res_i_7._4_4_ = res_i_7._4_4_ + 1) {
    a_i_6 = Hacl_Bignum_Base_mul_wide_add2_u32
                      (a[res_i_7._4_4_],uVar1,a_i_6,res + (ulong)res_i_7._4_4_ + 3);
  }
  res[6] = a_i_6;
  uVar1 = a[4];
  a_i_8 = 0;
  bVar2 = false;
  while (!bVar2) {
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar1,a_i_8,res + 4);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar1,uVar3,res + 5);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar1,uVar3,res + 6);
    a_i_8 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar1,uVar3,res + 7);
    bVar2 = true;
  }
  for (res_i_9._4_4_ = 4; res_i_9._4_4_ < 4; res_i_9._4_4_ = res_i_9._4_4_ + 1) {
    a_i_8 = Hacl_Bignum_Base_mul_wide_add2_u32(a[res_i_9._4_4_],uVar1,a_i_8,res + 4 + res_i_9._4_4_)
    ;
  }
  res[8] = a_i_8;
  uVar1 = a[5];
  a_i_10 = 0;
  bVar2 = false;
  while (!bVar2) {
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar1,a_i_10,res + 5);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar1,uVar3,res + 6);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar1,uVar3,res + 7);
    a_i_10 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar1,uVar3,res + 8);
    bVar2 = true;
  }
  for (res_i_11._4_4_ = 4; res_i_11._4_4_ < 5; res_i_11._4_4_ = res_i_11._4_4_ + 1) {
    a_i_10 = Hacl_Bignum_Base_mul_wide_add2_u32
                       (a[res_i_11._4_4_],uVar1,a_i_10,res + 5 + res_i_11._4_4_);
  }
  res[10] = a_i_10;
  uVar1 = a[6];
  a_i_12 = 0;
  bVar2 = false;
  while (!bVar2) {
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar1,a_i_12,res + 6);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar1,uVar3,res + 7);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar1,uVar3,res + 8);
    a_i_12 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar1,uVar3,res + 9);
    bVar2 = true;
  }
  for (res_i_13._4_4_ = 4; res_i_13._4_4_ < 6; res_i_13._4_4_ = res_i_13._4_4_ + 1) {
    a_i_12 = Hacl_Bignum_Base_mul_wide_add2_u32
                       (a[res_i_13._4_4_],uVar1,a_i_12,res + 6 + res_i_13._4_4_);
  }
  res[0xc] = a_i_12;
  uVar1 = a[7];
  a_i_14 = 0;
  bVar2 = false;
  while (!bVar2) {
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar1,a_i_14,res + 7);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar1,uVar3,res + 8);
    uVar3 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar1,uVar3,res + 9);
    a_i_14 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar1,uVar3,res + 10);
    bVar2 = true;
  }
  for (res_i_15._4_4_ = 4; res_i_15._4_4_ < 7; res_i_15._4_4_ = res_i_15._4_4_ + 1) {
    a_i_14 = Hacl_Bignum_Base_mul_wide_add2_u32
                       (a[res_i_15._4_4_],uVar1,a_i_14,res + 7 + res_i_15._4_4_);
  }
  res[0xe] = a_i_14;
  Hacl_Bignum_Addition_bn_add_eq_len_u32(0x10,res,res,res);
  memset(&stack0xfffffffffffffbd8,0,0x40);
  local_428 = (ulong)*a * (ulong)*a;
  tmp._0_8_ = (ulong)a[1] * (ulong)a[1];
  tmp._8_8_ = (ulong)a[2] * (ulong)a[2];
  tmp._16_8_ = (ulong)a[3] * (ulong)a[3];
  tmp._24_8_ = (ulong)a[4] * (ulong)a[4];
  tmp._32_8_ = (ulong)a[5] * (ulong)a[5];
  tmp._40_8_ = (ulong)a[6] * (ulong)a[6];
  tmp._48_8_ = (ulong)a[7] * (ulong)a[7];
  Hacl_Bignum_Addition_bn_add_eq_len_u32(0x10,res,(uint32_t *)&stack0xfffffffffffffbd8,res);
  return;
}

Assistant:

void Hacl_Bignum256_32_sqr(uint32_t *a, uint32_t *res)
{
  memset(res, 0U, 16U * sizeof (uint32_t));
  KRML_MAYBE_FOR8(i0,
    0U,
    8U,
    1U,
    uint32_t *ab = a;
    uint32_t a_j = a[i0];
    uint32_t *res_j = res + i0;
    uint32_t c = 0U;
    for (uint32_t i = 0U; i < i0 / 4U; i++)
    {
      uint32_t a_i = ab[4U * i];
      uint32_t *res_i0 = res_j + 4U * i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i0);
      uint32_t a_i0 = ab[4U * i + 1U];
      uint32_t *res_i1 = res_j + 4U * i + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, a_j, c, res_i1);
      uint32_t a_i1 = ab[4U * i + 2U];
      uint32_t *res_i2 = res_j + 4U * i + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, a_j, c, res_i2);
      uint32_t a_i2 = ab[4U * i + 3U];
      uint32_t *res_i = res_j + 4U * i + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, a_j, c, res_i);
    }
    for (uint32_t i = i0 / 4U * 4U; i < i0; i++)
    {
      uint32_t a_i = ab[i];
      uint32_t *res_i = res_j + i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i);
    }
    uint32_t r = c;
    res[i0 + i0] = r;);
  uint32_t c0 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, res, res);
  KRML_MAYBE_UNUSED_VAR(c0);
  uint32_t tmp[16U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint64_t res1 = (uint64_t)a[i] * (uint64_t)a[i];
    uint32_t hi = (uint32_t)(res1 >> 32U);
    uint32_t lo = (uint32_t)res1;
    tmp[2U * i] = lo;
    tmp[2U * i + 1U] = hi;);
  uint32_t c1 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, tmp, res);
  KRML_MAYBE_UNUSED_VAR(c1);
}